

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall Liby::http::HttpClient::handleReadEvent(HttpClient *this,Connection *conn)

{
  ReplyParser *this_00;
  int iVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  char *begin;
  char *pcVar4;
  off_t oVar5;
  Buffer *this_01;
  
  this_01 = &conn->readBuf_;
  this_00 = &this->parser_;
  while( true ) {
    bVar3 = Buffer::empty(this_01);
    if (bVar3) {
      return;
    }
    iVar1 = (this->parser_).bytes_;
    begin = Buffer::data(this_01);
    pcVar4 = Buffer::data(this_01);
    oVar5 = Buffer::size(this_01);
    ReplyParser::parse(this_00,begin,pcVar4 + oVar5);
    Buffer::retrieve(this_01,(long)(this->parser_).bytes_ - (long)iVar1);
    iVar1 = (this->parser_).progress_;
    if (6 < iVar1) break;
    if (iVar1 == 6) {
      p_Var2 = (this->sendReqeustLists_).
               super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var2[0xc]._M_next != (_List_node_base *)0x0) {
        std::function<void_(Liby::http::Reply_&)>::operator()
                  ((function<void_(Liby::http::Reply_&)> *)(p_Var2 + 0xb),&this_00->super_Reply);
      }
      ReplyParser::clear(this_00);
      std::__cxx11::
      list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
      ::pop_front(&this->sendReqeustLists_);
    }
  }
  destroy(this);
  return;
}

Assistant:

void HttpClient::handleReadEvent(Connection &conn) {
    while (1) {
        Buffer &readBuf = conn.read();
        if (readBuf.empty())
            return;

        int savedBytes = parser_.bytes_;
        parser_.parse(readBuf.data(), readBuf.data() + readBuf.size());
        readBuf.retrieve(parser_.bytes_ - savedBytes);

        if (parser_.isError()) {
            handleErroEvent(conn);
            return;
        }

        if (parser_.isGood()) {
            auto &handler = sendReqeustLists_.front().second;
            if (handler) {
                handler(parser_);
            }
            parser_.clear();
            sendReqeustLists_.pop_front();
        }
    }
}